

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O3

AssertionResult * __thiscall
iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,int>::operator()
          (AssertionResult *__return_storage_ptr__,
          PropertyMatcher<int((anonymous_namespace)::X::*)()const,int> *this,X *actual)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  code *pcVar3;
  AssertionResult *pAVar4;
  AssertionResult *extraout_RAX;
  AssertionResult *extraout_RAX_00;
  AssertionResult local_70;
  string local_48;
  int local_24;
  
  local_48._M_string_length = (size_type)(this + 0x10);
  local_48._M_dataplus._M_p = (pointer)&PTR__IMatcher_0023c380;
  pcVar3 = (code *)**(ulong **)(this + 8);
  if (((ulong)pcVar3 & 1) != 0) {
    pcVar3 = *(code **)(pcVar3 + *(long *)((long)&(anonymous_namespace)::gx +
                                          (*(ulong **)(this + 8))[1]) + -1);
  }
  local_24 = (*pcVar3)();
  EqMatcher<int>::operator()(&local_70,(EqMatcher<int> *)&local_48,&local_24);
  paVar1 = &local_70.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.m_message._M_dataplus._M_p,
                    CONCAT71(local_70.m_message.field_2._M_allocated_capacity._1_7_,
                             local_70.m_message.field_2._M_local_buf[0]) + 1);
  }
  if (local_70.m_result == false) {
    local_70.m_message._M_string_length = 0;
    local_70.m_message.field_2._M_local_buf[0] = '\0';
    local_70.m_result = false;
    local_70.m_message._M_dataplus._M_p = (pointer)paVar1;
    WhichIs_abi_cxx11_(&local_48,this);
    pAVar4 = AssertionResult::operator<<(&local_70,&local_48);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar4->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar4->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar4->m_result;
    pAVar4 = (AssertionResult *)&local_48.field_2;
    if ((AssertionResult *)local_48._M_dataplus._M_p != pAVar4) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      pAVar4 = extraout_RAX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_70.m_message._M_dataplus._M_p,
                      CONCAT71(local_70.m_message.field_2._M_allocated_capacity._1_7_,
                               local_70.m_message.field_2._M_local_buf[0]) + 1);
      pAVar4 = extraout_RAX_00;
    }
  }
  else {
    pAVar4 = (AssertionResult *)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)pAVar4;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return pAVar4;
}

Assistant:

IUTEST_COND_LIKELY( Check(actual) )
        {
            return AssertionSuccess();
        }